

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O2

void * alloc_small(j_common_ptr cinfo,int pool_id,size_t sizeofobject)

{
  code *pcVar1;
  _func_void_j_common_ptr **pp_Var2;
  jpeg_memory_mgr *pjVar3;
  jpeg_error_mgr *pjVar4;
  bool bVar5;
  _func_void_ptr_j_common_ptr_int_size_t **pp_Var6;
  ulong uVar7;
  _func_void_ptr_j_common_ptr_int_size_t **pp_Var8;
  size_t *psVar9;
  _func_void_ptr_j_common_ptr_int_size_t *p_Var10;
  _func_JSAMPARRAY_j_common_ptr_int_JDIMENSION_JDIMENSION *p_Var11;
  _func_JSAMPARRAY_j_common_ptr_int_JDIMENSION_JDIMENSION *p_Var12;
  long lVar13;
  _func_void_ptr_j_common_ptr_int_size_t **pp_Var14;
  ulong uVar15;
  
  pjVar3 = cinfo->mem;
  if (1000000000 < sizeofobject) {
    *(undefined8 *)&cinfo->err->msg_code = 0x700000036;
    (*cinfo->err->error_exit)(cinfo);
  }
  p_Var11 = (_func_JSAMPARRAY_j_common_ptr_int_JDIMENSION_JDIMENSION *)
            (sizeofobject + 0x1f & 0xffffffffffffffe0);
  pcVar1 = p_Var11 + 0x37;
  if ((code *)0x3b9aca00 < pcVar1) {
    *(undefined8 *)&cinfo->err->msg_code = 0x100000036;
    (*cinfo->err->error_exit)(cinfo);
  }
  if (1 < (uint)pool_id) {
    pjVar4 = cinfo->err;
    pjVar4->msg_code = 0xe;
    (pjVar4->msg_parm).i[0] = pool_id;
    (*cinfo->err->error_exit)(cinfo);
  }
  pp_Var8 = &pjVar3[1].alloc_small + pool_id;
  pp_Var6 = pp_Var8;
  pp_Var14 = (_func_void_ptr_j_common_ptr_int_size_t **)0x0;
  do {
    pp_Var6 = (_func_void_ptr_j_common_ptr_int_size_t **)*pp_Var6;
    if (pp_Var6 == (_func_void_ptr_j_common_ptr_int_size_t **)0x0) {
      psVar9 = extra_pool_slop;
      if (pp_Var14 == (_func_void_ptr_j_common_ptr_int_size_t **)0x0) {
        psVar9 = first_pool_slop;
      }
      uVar7 = 0x3b9ac9c9U - (long)p_Var11;
      if (psVar9[pool_id] < 0x3b9ac9c9U - (long)p_Var11) {
        uVar7 = psVar9[pool_id];
      }
      while( true ) {
        pp_Var6 = (_func_void_ptr_j_common_ptr_int_size_t **)
                  jpeg_get_small(cinfo,(size_t)(pcVar1 + uVar7));
        if (pp_Var6 != (_func_void_ptr_j_common_ptr_int_size_t **)0x0) break;
        uVar15 = uVar7 >> 1;
        bVar5 = uVar7 < 100;
        uVar7 = uVar15;
        if (bVar5) {
          *(undefined8 *)&cinfo->err->msg_code = 0x200000036;
          (*cinfo->err->error_exit)(cinfo);
        }
      }
      pp_Var2 = &pjVar3[1].realize_virt_arrays;
      *pp_Var2 = *pp_Var2 + (long)(pcVar1 + uVar7);
      p_Var12 = p_Var11 + uVar7;
      *pp_Var6 = (_func_void_ptr_j_common_ptr_int_size_t *)0x0;
      pp_Var6[1] = (_func_void_ptr_j_common_ptr_int_size_t *)0x0;
      pp_Var6[2] = (_func_void_ptr_j_common_ptr_int_size_t *)p_Var12;
      if (pp_Var14 == (_func_void_ptr_j_common_ptr_int_size_t **)0x0) {
        *pp_Var8 = (_func_void_ptr_j_common_ptr_int_size_t *)pp_Var6;
      }
      else {
        *pp_Var14 = (_func_void_ptr_j_common_ptr_int_size_t *)pp_Var6;
      }
      p_Var10 = (_func_void_ptr_j_common_ptr_int_size_t *)0x0;
      goto LAB_00113ab1;
    }
    p_Var12 = (_func_JSAMPARRAY_j_common_ptr_int_JDIMENSION_JDIMENSION *)pp_Var6[2];
    pp_Var14 = pp_Var6;
  } while (p_Var12 < p_Var11);
  p_Var10 = pp_Var6[1];
LAB_00113ab1:
  uVar7 = (ulong)((int)pp_Var6 + 0x18U & 0x1f);
  lVar13 = 0x20 - uVar7;
  if (uVar7 == 0) {
    lVar13 = 0;
  }
  pp_Var6[1] = p_Var10 + (long)p_Var11;
  pp_Var6[2] = (_func_void_ptr_j_common_ptr_int_size_t *)(p_Var12 + -(long)p_Var11);
  return (_func_void_ptr_j_common_ptr_int_size_t *)((long)pp_Var6 + (long)(p_Var10 + lVar13 + 0x18))
  ;
}

Assistant:

METHODDEF(void *)
alloc_small(j_common_ptr cinfo, int pool_id, size_t sizeofobject)
/* Allocate a "small" object */
{
  my_mem_ptr mem = (my_mem_ptr)cinfo->mem;
  small_pool_ptr hdr_ptr, prev_hdr_ptr;
  char *data_ptr;
  size_t min_request, slop;

  /*
   * Round up the requested size to a multiple of ALIGN_SIZE in order
   * to assure alignment for the next object allocated in the same pool
   * and so that algorithms can straddle outside the proper area up
   * to the next alignment.
   */
  if (sizeofobject > MAX_ALLOC_CHUNK) {
    /* This prevents overflow/wrap-around in round_up_pow2() if sizeofobject
       is close to SIZE_MAX. */
    out_of_memory(cinfo, 7);
  }
  sizeofobject = round_up_pow2(sizeofobject, ALIGN_SIZE);

  /* Check for unsatisfiable request (do now to ensure no overflow below) */
  if ((sizeof(small_pool_hdr) + sizeofobject + ALIGN_SIZE - 1) >
      MAX_ALLOC_CHUNK)
    out_of_memory(cinfo, 1);    /* request exceeds malloc's ability */

  /* See if space is available in any existing pool */
  if (pool_id < 0 || pool_id >= JPOOL_NUMPOOLS)
    ERREXIT1(cinfo, JERR_BAD_POOL_ID, pool_id); /* safety check */
  prev_hdr_ptr = NULL;
  hdr_ptr = mem->small_list[pool_id];
  while (hdr_ptr != NULL) {
    if (hdr_ptr->bytes_left >= sizeofobject)
      break;                    /* found pool with enough space */
    prev_hdr_ptr = hdr_ptr;
    hdr_ptr = hdr_ptr->next;
  }

  /* Time to make a new pool? */
  if (hdr_ptr == NULL) {
    /* min_request is what we need now, slop is what will be leftover */
    min_request = sizeof(small_pool_hdr) + sizeofobject + ALIGN_SIZE - 1;
    if (prev_hdr_ptr == NULL)   /* first pool in class? */
      slop = first_pool_slop[pool_id];
    else
      slop = extra_pool_slop[pool_id];
    /* Don't ask for more than MAX_ALLOC_CHUNK */
    if (slop > (size_t)(MAX_ALLOC_CHUNK - min_request))
      slop = (size_t)(MAX_ALLOC_CHUNK - min_request);
    /* Try to get space, if fail reduce slop and try again */
    for (;;) {
      hdr_ptr = (small_pool_ptr)jpeg_get_small(cinfo, min_request + slop);
      if (hdr_ptr != NULL)
        break;
      slop /= 2;
      if (slop < MIN_SLOP)      /* give up when it gets real small */
        out_of_memory(cinfo, 2); /* jpeg_get_small failed */
    }
    mem->total_space_allocated += min_request + slop;
    /* Success, initialize the new pool header and add to end of list */
    hdr_ptr->next = NULL;
    hdr_ptr->bytes_used = 0;
    hdr_ptr->bytes_left = sizeofobject + slop;
    if (prev_hdr_ptr == NULL)   /* first pool in class? */
      mem->small_list[pool_id] = hdr_ptr;
    else
      prev_hdr_ptr->next = hdr_ptr;
  }

  /* OK, allocate the object from the current pool */
  data_ptr = (char *)hdr_ptr; /* point to first data byte in pool... */
  data_ptr += sizeof(small_pool_hdr); /* ...by skipping the header... */
  if ((size_t)data_ptr % ALIGN_SIZE) /* ...and adjust for alignment */
    data_ptr += ALIGN_SIZE - (size_t)data_ptr % ALIGN_SIZE;
  data_ptr += hdr_ptr->bytes_used; /* point to place for object */
  hdr_ptr->bytes_used += sizeofobject;
  hdr_ptr->bytes_left -= sizeofobject;

  return (void *)data_ptr;
}